

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O3

bool __thiscall
EncodingConversion::decode
          (EncodingConversion *this,u16string *string,FILE *stream,
          vector<char,_std::allocator<char>_> *input_vector,
          function<void_(unsigned_long)> *progress_callback)

{
  char *input_start;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  char *extraout_RDX;
  pointer output_end;
  pointer pcVar6;
  u16string *this_00;
  EncodingConversion *this_01;
  uint uVar7;
  ulong uVar8;
  size_type __n_00;
  long lVar9;
  ulong uVar10;
  float fVar11;
  pointer pcStack_b0;
  char *pcStack_a8;
  uint uStack_9c;
  char *pcStack_98;
  EncodingConversion *pEStack_90;
  FILE *pFStack_88;
  ulong uStack_80;
  size_t sStack_78;
  long lStack_70;
  ulong uStack_68;
  code *pcStack_60;
  vector<char,_std::allocator<char>_> *local_58;
  EncodingConversion *local_50;
  u16string *local_48;
  EncodingConversion *local_40;
  long local_38;
  
  input_start = *(char **)input_vector;
  lVar9 = 0;
  __n = 0;
  pcVar2 = input_start;
  local_58 = input_vector;
  local_50 = this;
  local_48 = string;
  local_40 = (EncodingConversion *)progress_callback;
  while( true ) {
    uVar10 = *(long *)(local_58 + 8) - (long)(pcVar2 + __n);
    pcStack_60 = (code *)0x15fdd4;
    sVar3 = fread(input_start + __n,1,uVar10,(FILE *)stream);
    if (sVar3 < uVar10) {
      pcStack_60 = (code *)0x15fde4;
      iVar1 = ferror((FILE *)stream);
      if (iVar1 != 0) {
        return false;
      }
    }
    uVar8 = __n + sVar3;
    if (uVar8 == 0) {
      return true;
    }
    uVar7 = (uint)(sVar3 == 0);
    pcStack_60 = (code *)0x15fe0c;
    uVar5 = uVar8;
    this_00 = local_48;
    sVar4 = decode(local_50,local_48,input_start,uVar8,sVar3 == 0);
    lVar9 = lVar9 + sVar4;
    local_38 = lVar9;
    if (local_40[1].data == (void *)0x0) break;
    pcStack_60 = (code *)0x15fe2b;
    (**(code **)&local_40[1].mode)(local_40,&local_38);
    __n = uVar8 - sVar4;
    if (sVar4 <= uVar8 && __n != 0) {
      __n = uVar8 - sVar4;
      pcStack_60 = (code *)0x15fe47;
      memmove(input_start,input_start + sVar4,__n);
    }
    pcVar2 = *(char **)local_58;
  }
  pcStack_60 = decode;
  this_01 = local_40;
  std::__throw_bad_function_call();
  __n_00 = this_00->_M_string_length;
  uStack_9c = uVar7;
  pFStack_88 = stream;
  uStack_80 = uVar8;
  sStack_78 = sVar3;
  lStack_70 = lVar9;
  uStack_68 = uVar10;
  pcStack_60 = (code *)input_start;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  resize(this_00,uVar5 + __n_00,L'\0');
  pcVar6 = (this_00->_M_dataplus)._M_p;
  pcStack_b0 = pcVar6 + __n_00;
  pcStack_a8 = extraout_RDX;
  pcStack_98 = extraout_RDX;
  if (0 < (long)uVar5) {
    output_end = pcStack_b0 + uVar5;
    pEStack_90 = this_01;
    do {
      iVar1 = convert(this_01,&pcStack_a8,extraout_RDX + uVar5,(char **)&pcStack_b0,
                      (char *)output_end);
      __n_00 = ((long)pcStack_b0 - (long)pcVar6) / 2;
      if (iVar1 == 1) {
        uVar10 = this_00->_M_string_length;
        fVar11 = (float)uVar10;
        fVar11 = fVar11 + fVar11;
        uVar8 = (ulong)fVar11;
        uVar8 = (long)(fVar11 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::resize(this_00,uVar8,L'\0');
        pcVar6 = (this_00->_M_dataplus)._M_p;
        pcStack_b0 = (pointer)(uVar10 + (long)pcVar6);
        output_end = (pointer)(uVar8 + (long)pcVar6);
        this_01 = pEStack_90;
      }
      else {
        if (iVar1 != 2) {
          if (iVar1 != 3) goto LAB_0015ffb4;
          if ((char)uStack_9c == '\0') break;
        }
        pcStack_a8 = pcStack_a8 + 1;
        (this_00->_M_dataplus)._M_p[__n_00] = L'�';
        pcStack_b0 = pcStack_b0 + 1;
        __n_00 = __n_00 + 1;
      }
LAB_0015ffb4:
    } while (pcStack_a8 < extraout_RDX + uVar5);
  }
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  resize(this_00,__n_00,L'\0');
  return (bool)((char)pcStack_a8 - (char)pcStack_98);
}

Assistant:

bool EncodingConversion::decode(u16string &string, FILE *stream,
                                vector<char> &input_vector,
                                function<void(size_t)> progress_callback) {
  char *input_buffer = input_vector.data();
  size_t bytes_left_over = 0;
  size_t total_bytes_read = 0;

  for (;;) {
    size_t bytes_to_read = input_vector.size() - bytes_left_over;
    size_t bytes_read = fread(input_buffer + bytes_left_over, 1, bytes_to_read, stream);
    if (bytes_read < bytes_to_read && ferror(stream)) return false;
    size_t bytes_to_append = bytes_left_over + bytes_read;
    if (bytes_to_append == 0) break;

    size_t bytes_appended = decode(
      string,
      input_buffer,
      bytes_to_append,
      bytes_read == 0
    );

    total_bytes_read += bytes_appended;
    progress_callback(total_bytes_read);

    if (bytes_appended < bytes_to_append) {
      std::copy(input_buffer + bytes_appended, input_buffer + bytes_to_append, input_buffer);
    }

    bytes_left_over = bytes_to_append - bytes_appended;
  }

  return true;
}